

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel_resize.cpp
# Opt level: O1

void ncnn::vresize_two(short *rows0p,short *rows1p,int wsize,uchar *Dp0,uchar *Dp1,short b0,short b1
                      ,short b2,short b3)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  short sVar32;
  uint uVar33;
  int iVar34;
  undefined6 in_register_0000008a;
  long lVar35;
  undefined1 (*pauVar36) [16];
  undefined1 (*pauVar37) [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined2 in_stack_0000000a;
  undefined2 in_stack_00000012;
  undefined2 in_stack_0000001a;
  
  auVar38 = ZEXT416((uint)CONCAT62(in_register_0000008a,b0));
  auVar38 = pshuflw(auVar38,auVar38,0);
  auVar38._4_4_ = auVar38._0_4_;
  auVar38._8_4_ = auVar38._0_4_;
  auVar38._12_4_ = auVar38._0_4_;
  auVar39 = pshuflw(ZEXT416(_b1),ZEXT416(_b1),0);
  auVar39._4_4_ = auVar39._0_4_;
  auVar39._8_4_ = auVar39._0_4_;
  auVar39._12_4_ = auVar39._0_4_;
  auVar40 = pshuflw(ZEXT416(_b2),ZEXT416(_b2),0);
  auVar40._4_4_ = auVar40._0_4_;
  auVar40._8_4_ = auVar40._0_4_;
  auVar40._12_4_ = auVar40._0_4_;
  auVar41 = pshuflw(ZEXT416(_b3),ZEXT416(_b3),0);
  auVar41._4_4_ = auVar41._0_4_;
  auVar41._8_4_ = auVar41._0_4_;
  auVar41._12_4_ = auVar41._0_4_;
  uVar33 = 0;
  if (0xf < wsize) {
    uVar33 = wsize & 0x7ffffff0;
    iVar34 = 0xf;
    do {
      auVar48 = pmulhw(*(undefined1 (*) [16])rows0p,auVar38);
      auVar44 = pmulhw(*(undefined1 (*) [16])rows1p,auVar39);
      auVar49 = pmulhw(*(undefined1 (*) [16])((long)rows0p + 0x10),auVar38);
      auVar50 = pmulhw(*(undefined1 (*) [16])((long)rows1p + 0x10),auVar39);
      auVar46 = pmulhw(*(undefined1 (*) [16])rows0p,auVar40);
      auVar42 = pmulhw(*(undefined1 (*) [16])rows1p,auVar41);
      auVar47 = pmulhw(*(undefined1 (*) [16])((long)rows0p + 0x10),auVar40);
      auVar43 = pmulhw(*(undefined1 (*) [16])((long)rows1p + 0x10),auVar41);
      auVar45._0_2_ = auVar44._0_2_ + auVar48._0_2_ + 2;
      auVar45._2_2_ = auVar44._2_2_ + auVar48._2_2_ + 2;
      auVar45._4_2_ = auVar44._4_2_ + auVar48._4_2_ + 2;
      auVar45._6_2_ = auVar44._6_2_ + auVar48._6_2_ + 2;
      auVar45._8_2_ = auVar44._8_2_ + auVar48._8_2_ + 2;
      auVar45._10_2_ = auVar44._10_2_ + auVar48._10_2_ + 2;
      auVar45._12_2_ = auVar44._12_2_ + auVar48._12_2_ + 2;
      auVar45._14_2_ = auVar44._14_2_ + auVar48._14_2_ + 2;
      auVar45 = psraw(auVar45,2);
      auVar48._0_2_ = auVar50._0_2_ + auVar49._0_2_ + 2;
      auVar48._2_2_ = auVar50._2_2_ + auVar49._2_2_ + 2;
      auVar48._4_2_ = auVar50._4_2_ + auVar49._4_2_ + 2;
      auVar48._6_2_ = auVar50._6_2_ + auVar49._6_2_ + 2;
      auVar48._8_2_ = auVar50._8_2_ + auVar49._8_2_ + 2;
      auVar48._10_2_ = auVar50._10_2_ + auVar49._10_2_ + 2;
      auVar48._12_2_ = auVar50._12_2_ + auVar49._12_2_ + 2;
      auVar48._14_2_ = auVar50._14_2_ + auVar49._14_2_ + 2;
      auVar48 = psraw(auVar48,2);
      sVar1 = auVar45._0_2_;
      sVar3 = auVar45._2_2_;
      sVar5 = auVar45._4_2_;
      sVar7 = auVar45._6_2_;
      sVar9 = auVar45._8_2_;
      sVar11 = auVar45._10_2_;
      sVar13 = auVar45._12_2_;
      sVar15 = auVar45._14_2_;
      sVar17 = auVar48._0_2_;
      sVar19 = auVar48._2_2_;
      sVar21 = auVar48._4_2_;
      sVar23 = auVar48._6_2_;
      sVar25 = auVar48._8_2_;
      sVar27 = auVar48._10_2_;
      sVar29 = auVar48._12_2_;
      sVar31 = auVar48._14_2_;
      auVar44._0_2_ = auVar42._0_2_ + auVar46._0_2_ + 2;
      auVar44._2_2_ = auVar42._2_2_ + auVar46._2_2_ + 2;
      auVar44._4_2_ = auVar42._4_2_ + auVar46._4_2_ + 2;
      auVar44._6_2_ = auVar42._6_2_ + auVar46._6_2_ + 2;
      auVar44._8_2_ = auVar42._8_2_ + auVar46._8_2_ + 2;
      auVar44._10_2_ = auVar42._10_2_ + auVar46._10_2_ + 2;
      auVar44._12_2_ = auVar42._12_2_ + auVar46._12_2_ + 2;
      auVar44._14_2_ = auVar42._14_2_ + auVar46._14_2_ + 2;
      auVar42 = psraw(auVar44,2);
      auVar46._0_2_ = auVar43._0_2_ + auVar47._0_2_ + 2;
      auVar46._2_2_ = auVar43._2_2_ + auVar47._2_2_ + 2;
      auVar46._4_2_ = auVar43._4_2_ + auVar47._4_2_ + 2;
      auVar46._6_2_ = auVar43._6_2_ + auVar47._6_2_ + 2;
      auVar46._8_2_ = auVar43._8_2_ + auVar47._8_2_ + 2;
      auVar46._10_2_ = auVar43._10_2_ + auVar47._10_2_ + 2;
      auVar46._12_2_ = auVar43._12_2_ + auVar47._12_2_ + 2;
      auVar46._14_2_ = auVar43._14_2_ + auVar47._14_2_ + 2;
      auVar44 = psraw(auVar46,2);
      sVar2 = auVar42._0_2_;
      sVar4 = auVar42._2_2_;
      sVar6 = auVar42._4_2_;
      sVar8 = auVar42._6_2_;
      sVar10 = auVar42._8_2_;
      sVar12 = auVar42._10_2_;
      sVar14 = auVar42._12_2_;
      sVar16 = auVar42._14_2_;
      sVar18 = auVar44._0_2_;
      sVar20 = auVar44._2_2_;
      sVar22 = auVar44._4_2_;
      sVar24 = auVar44._6_2_;
      sVar26 = auVar44._8_2_;
      sVar28 = auVar44._10_2_;
      sVar30 = auVar44._12_2_;
      sVar32 = auVar44._14_2_;
      *Dp0 = (0 < sVar1) * (sVar1 < 0x100) * auVar45[0] - (0xff < sVar1);
      Dp0[1] = (0 < sVar3) * (sVar3 < 0x100) * auVar45[2] - (0xff < sVar3);
      Dp0[2] = (0 < sVar5) * (sVar5 < 0x100) * auVar45[4] - (0xff < sVar5);
      Dp0[3] = (0 < sVar7) * (sVar7 < 0x100) * auVar45[6] - (0xff < sVar7);
      Dp0[4] = (0 < sVar9) * (sVar9 < 0x100) * auVar45[8] - (0xff < sVar9);
      Dp0[5] = (0 < sVar11) * (sVar11 < 0x100) * auVar45[10] - (0xff < sVar11);
      Dp0[6] = (0 < sVar13) * (sVar13 < 0x100) * auVar45[0xc] - (0xff < sVar13);
      Dp0[7] = (0 < sVar15) * (sVar15 < 0x100) * auVar45[0xe] - (0xff < sVar15);
      Dp0[8] = (0 < sVar17) * (sVar17 < 0x100) * auVar48[0] - (0xff < sVar17);
      Dp0[9] = (0 < sVar19) * (sVar19 < 0x100) * auVar48[2] - (0xff < sVar19);
      Dp0[10] = (0 < sVar21) * (sVar21 < 0x100) * auVar48[4] - (0xff < sVar21);
      Dp0[0xb] = (0 < sVar23) * (sVar23 < 0x100) * auVar48[6] - (0xff < sVar23);
      Dp0[0xc] = (0 < sVar25) * (sVar25 < 0x100) * auVar48[8] - (0xff < sVar25);
      Dp0[0xd] = (0 < sVar27) * (sVar27 < 0x100) * auVar48[10] - (0xff < sVar27);
      Dp0[0xe] = (0 < sVar29) * (sVar29 < 0x100) * auVar48[0xc] - (0xff < sVar29);
      Dp0[0xf] = (0 < sVar31) * (sVar31 < 0x100) * auVar48[0xe] - (0xff < sVar31);
      *Dp1 = (0 < sVar2) * (sVar2 < 0x100) * auVar42[0] - (0xff < sVar2);
      Dp1[1] = (0 < sVar4) * (sVar4 < 0x100) * auVar42[2] - (0xff < sVar4);
      Dp1[2] = (0 < sVar6) * (sVar6 < 0x100) * auVar42[4] - (0xff < sVar6);
      Dp1[3] = (0 < sVar8) * (sVar8 < 0x100) * auVar42[6] - (0xff < sVar8);
      Dp1[4] = (0 < sVar10) * (sVar10 < 0x100) * auVar42[8] - (0xff < sVar10);
      Dp1[5] = (0 < sVar12) * (sVar12 < 0x100) * auVar42[10] - (0xff < sVar12);
      Dp1[6] = (0 < sVar14) * (sVar14 < 0x100) * auVar42[0xc] - (0xff < sVar14);
      Dp1[7] = (0 < sVar16) * (sVar16 < 0x100) * auVar42[0xe] - (0xff < sVar16);
      Dp1[8] = (0 < sVar18) * (sVar18 < 0x100) * auVar44[0] - (0xff < sVar18);
      Dp1[9] = (0 < sVar20) * (sVar20 < 0x100) * auVar44[2] - (0xff < sVar20);
      Dp1[10] = (0 < sVar22) * (sVar22 < 0x100) * auVar44[4] - (0xff < sVar22);
      Dp1[0xb] = (0 < sVar24) * (sVar24 < 0x100) * auVar44[6] - (0xff < sVar24);
      Dp1[0xc] = (0 < sVar26) * (sVar26 < 0x100) * auVar44[8] - (0xff < sVar26);
      Dp1[0xd] = (0 < sVar28) * (sVar28 < 0x100) * auVar44[10] - (0xff < sVar28);
      Dp1[0xe] = (0 < sVar30) * (sVar30 < 0x100) * auVar44[0xc] - (0xff < sVar30);
      Dp1[0xf] = (0 < sVar32) * (sVar32 < 0x100) * auVar44[0xe] - (0xff < sVar32);
      Dp0 = Dp0 + 0x10;
      Dp1 = Dp1 + 0x10;
      rows0p = (short *)((long)rows0p + 0x20);
      rows1p = (short *)((long)rows1p + 0x20);
      iVar34 = iVar34 + 0x10;
    } while (iVar34 < wsize);
  }
  if ((int)(uVar33 | 7) < wsize) {
    lVar35 = 0;
    pauVar36 = (undefined1 (*) [16])rows1p;
    pauVar37 = (undefined1 (*) [16])rows0p;
    do {
      auVar43 = pmulhw(*(undefined1 (*) [16])(*(undefined1 (*) [16])rows0p + lVar35 * 2),auVar38);
      auVar46 = pmulhw(*(undefined1 (*) [16])(*(undefined1 (*) [16])rows1p + lVar35 * 2),auVar39);
      auVar42 = pmulhw(*(undefined1 (*) [16])(*(undefined1 (*) [16])rows0p + lVar35 * 2),auVar40);
      auVar44 = pmulhw(*(undefined1 (*) [16])(*(undefined1 (*) [16])rows1p + lVar35 * 2),auVar41);
      auVar47._0_2_ = auVar46._0_2_ + auVar43._0_2_ + 2;
      auVar47._2_2_ = auVar46._2_2_ + auVar43._2_2_ + 2;
      auVar47._4_2_ = auVar46._4_2_ + auVar43._4_2_ + 2;
      auVar47._6_2_ = auVar46._6_2_ + auVar43._6_2_ + 2;
      auVar47._8_2_ = auVar46._8_2_ + auVar43._8_2_ + 2;
      auVar47._10_2_ = auVar46._10_2_ + auVar43._10_2_ + 2;
      auVar47._12_2_ = auVar46._12_2_ + auVar43._12_2_ + 2;
      auVar47._14_2_ = auVar46._14_2_ + auVar43._14_2_ + 2;
      auVar46 = psraw(auVar47,2);
      sVar1 = auVar46._0_2_;
      sVar3 = auVar46._2_2_;
      sVar5 = auVar46._4_2_;
      sVar7 = auVar46._6_2_;
      sVar9 = auVar46._8_2_;
      sVar11 = auVar46._10_2_;
      sVar13 = auVar46._12_2_;
      sVar15 = auVar46._14_2_;
      auVar43._0_2_ = auVar44._0_2_ + auVar42._0_2_ + 2;
      auVar43._2_2_ = auVar44._2_2_ + auVar42._2_2_ + 2;
      auVar43._4_2_ = auVar44._4_2_ + auVar42._4_2_ + 2;
      auVar43._6_2_ = auVar44._6_2_ + auVar42._6_2_ + 2;
      auVar43._8_2_ = auVar44._8_2_ + auVar42._8_2_ + 2;
      auVar43._10_2_ = auVar44._10_2_ + auVar42._10_2_ + 2;
      auVar43._12_2_ = auVar44._12_2_ + auVar42._12_2_ + 2;
      auVar43._14_2_ = auVar44._14_2_ + auVar42._14_2_ + 2;
      auVar42 = psraw(auVar43,2);
      sVar2 = auVar42._0_2_;
      sVar4 = auVar42._2_2_;
      sVar6 = auVar42._4_2_;
      sVar8 = auVar42._6_2_;
      sVar10 = auVar42._8_2_;
      sVar12 = auVar42._10_2_;
      sVar14 = auVar42._12_2_;
      sVar16 = auVar42._14_2_;
      *(ulong *)(Dp0 + lVar35) =
           CONCAT17((0 < sVar15) * (sVar15 < 0x100) * auVar46[0xe] - (0xff < sVar15),
                    CONCAT16((0 < sVar13) * (sVar13 < 0x100) * auVar46[0xc] - (0xff < sVar13),
                             CONCAT15((0 < sVar11) * (sVar11 < 0x100) * auVar46[10] -
                                      (0xff < sVar11),
                                      CONCAT14((0 < sVar9) * (sVar9 < 0x100) * auVar46[8] -
                                               (0xff < sVar9),
                                               CONCAT13((0 < sVar7) * (sVar7 < 0x100) * auVar46[6] -
                                                        (0xff < sVar7),
                                                        CONCAT12((0 < sVar5) * (sVar5 < 0x100) *
                                                                 auVar46[4] - (0xff < sVar5),
                                                                 CONCAT11((0 < sVar3) *
                                                                          (sVar3 < 0x100) *
                                                                          auVar46[2] -
                                                                          (0xff < sVar3),
                                                                          (0 < sVar1) *
                                                                          (sVar1 < 0x100) *
                                                                          auVar46[0] -
                                                                          (0xff < sVar1))))))));
      *(ulong *)(Dp1 + lVar35) =
           CONCAT17((0 < sVar16) * (sVar16 < 0x100) * auVar42[0xe] - (0xff < sVar16),
                    CONCAT16((0 < sVar14) * (sVar14 < 0x100) * auVar42[0xc] - (0xff < sVar14),
                             CONCAT15((0 < sVar12) * (sVar12 < 0x100) * auVar42[10] -
                                      (0xff < sVar12),
                                      CONCAT14((0 < sVar10) * (sVar10 < 0x100) * auVar42[8] -
                                               (0xff < sVar10),
                                               CONCAT13((0 < sVar8) * (sVar8 < 0x100) * auVar42[6] -
                                                        (0xff < sVar8),
                                                        CONCAT12((0 < sVar6) * (sVar6 < 0x100) *
                                                                 auVar42[4] - (0xff < sVar6),
                                                                 CONCAT11((0 < sVar4) *
                                                                          (sVar4 < 0x100) *
                                                                          auVar42[2] -
                                                                          (0xff < sVar4),
                                                                          (0 < sVar2) *
                                                                          (sVar2 < 0x100) *
                                                                          auVar42[0] -
                                                                          (0xff < sVar2))))))));
      pauVar37 = pauVar37 + 1;
      pauVar36 = pauVar36 + 1;
      lVar35 = lVar35 + 8;
    } while ((int)((int)lVar35 + uVar33 + 7) < wsize);
    Dp0 = Dp0 + lVar35;
    Dp1 = Dp1 + lVar35;
    uVar33 = uVar33 + (int)lVar35;
    rows1p = (short *)pauVar36;
    rows0p = (short *)pauVar37;
  }
  if ((int)uVar33 < wsize) {
    lVar35 = 0;
    do {
      sVar1 = *(short *)(*(undefined1 (*) [16])rows0p + lVar35 * 2);
      sVar2 = *(short *)(*(undefined1 (*) [16])rows1p + lVar35 * 2);
      Dp0[lVar35] = (uchar)(((uint)((int)sVar1 * (int)b0) >> 0x10) +
                            ((uint)((int)sVar2 * (int)b1) >> 0x10) + 2 >> 2);
      Dp1[lVar35] = (uchar)(((uint)((int)sVar1 * (int)b2) >> 0x10) +
                            ((uint)((int)sVar2 * (int)b3) >> 0x10) + 2 >> 2);
      lVar35 = lVar35 + 1;
    } while (wsize - uVar33 != (int)lVar35);
  }
  return;
}

Assistant:

static void vresize_two(const short* rows0p, const short* rows1p, int wsize, unsigned char* Dp0, unsigned char* Dp1, short b0, short b1, short b2, short b3)
{
    int dx = 0;
#if __ARM_NEON
    int16x8_t _b0 = vdupq_n_s16(b0);
    int16x8_t _b1 = vdupq_n_s16(b1);
    int16x8_t _b2 = vdupq_n_s16(b2);
    int16x8_t _b3 = vdupq_n_s16(b3);
    for (; dx + 15 < wsize; dx += 16)
    {
        int16x8_t _r00 = vld1q_s16(rows0p);
        int16x8_t _r01 = vld1q_s16(rows0p + 8);
        int16x8_t _r10 = vld1q_s16(rows1p);
        int16x8_t _r11 = vld1q_s16(rows1p + 8);
        int16x8_t _acc00 = vsraq_n_s16(vshrq_n_s16(vqdmulhq_s16(_r00, _b0), 1), vqdmulhq_s16(_r10, _b1), 1);
        int16x8_t _acc01 = vsraq_n_s16(vshrq_n_s16(vqdmulhq_s16(_r01, _b0), 1), vqdmulhq_s16(_r11, _b1), 1);
        int16x8_t _acc10 = vsraq_n_s16(vshrq_n_s16(vqdmulhq_s16(_r00, _b2), 1), vqdmulhq_s16(_r10, _b3), 1);
        int16x8_t _acc11 = vsraq_n_s16(vshrq_n_s16(vqdmulhq_s16(_r01, _b2), 1), vqdmulhq_s16(_r11, _b3), 1);
        uint8x16_t _Dp0 = vcombine_u8(vqrshrun_n_s16(_acc00, 2), vqrshrun_n_s16(_acc01, 2));
        uint8x16_t _Dp1 = vcombine_u8(vqrshrun_n_s16(_acc10, 2), vqrshrun_n_s16(_acc11, 2));
        vst1q_u8(Dp0, _Dp0);
        vst1q_u8(Dp1, _Dp1);
        Dp0 += 16;
        Dp1 += 16;
        rows0p += 16;
        rows1p += 16;
    }
    for (; dx + 7 < wsize; dx += 8)
    {
        int16x8_t _r0 = vld1q_s16(rows0p);
        int16x8_t _r1 = vld1q_s16(rows1p);
        int16x8_t _acc0 = vsraq_n_s16(vshrq_n_s16(vqdmulhq_s16(_r0, _b0), 1), vqdmulhq_s16(_r1, _b1), 1);
        int16x8_t _acc1 = vsraq_n_s16(vshrq_n_s16(vqdmulhq_s16(_r0, _b2), 1), vqdmulhq_s16(_r1, _b3), 1);
        uint8x8_t _Dp0 = vqrshrun_n_s16(_acc0, 2);
        uint8x8_t _Dp1 = vqrshrun_n_s16(_acc1, 2);
        vst1_u8(Dp0, _Dp0);
        vst1_u8(Dp1, _Dp1);
        Dp0 += 8;
        Dp1 += 8;
        rows0p += 8;
        rows1p += 8;
    }
#endif // __ARM_NEON
#if __SSE2__
    __m128i _b0 = _mm_set1_epi16(b0);
    __m128i _b1 = _mm_set1_epi16(b1);
    __m128i _b2 = _mm_set1_epi16(b2);
    __m128i _b3 = _mm_set1_epi16(b3);
    __m128i _v2 = _mm_set1_epi16(2);
    for (; dx + 15 < wsize; dx += 16)
    {
        __m128i _r00 = _mm_loadu_si128((const __m128i*)rows0p);
        __m128i _r01 = _mm_loadu_si128((const __m128i*)(rows0p + 8));
        __m128i _r10 = _mm_loadu_si128((const __m128i*)rows1p);
        __m128i _r11 = _mm_loadu_si128((const __m128i*)(rows1p + 8));
        __m128i _acc00 = _mm_add_epi16(_mm_mulhi_epi16(_r00, _b0), _mm_mulhi_epi16(_r10, _b1));
        __m128i _acc01 = _mm_add_epi16(_mm_mulhi_epi16(_r01, _b0), _mm_mulhi_epi16(_r11, _b1));
        __m128i _acc10 = _mm_add_epi16(_mm_mulhi_epi16(_r00, _b2), _mm_mulhi_epi16(_r10, _b3));
        __m128i _acc11 = _mm_add_epi16(_mm_mulhi_epi16(_r01, _b2), _mm_mulhi_epi16(_r11, _b3));
        _acc00 = _mm_srai_epi16(_mm_add_epi16(_acc00, _v2), 2);
        _acc01 = _mm_srai_epi16(_mm_add_epi16(_acc01, _v2), 2);
        _acc10 = _mm_srai_epi16(_mm_add_epi16(_acc10, _v2), 2);
        _acc11 = _mm_srai_epi16(_mm_add_epi16(_acc11, _v2), 2);
        __m128i _Dp0 = _mm_packus_epi16(_acc00, _acc01);
        __m128i _Dp1 = _mm_packus_epi16(_acc10, _acc11);
        _mm_storeu_si128((__m128i*)Dp0, _Dp0);
        _mm_storeu_si128((__m128i*)Dp1, _Dp1);
        Dp0 += 16;
        Dp1 += 16;
        rows0p += 16;
        rows1p += 16;
    }
    for (; dx + 7 < wsize; dx += 8)
    {
        __m128i _r0 = _mm_loadu_si128((const __m128i*)rows0p);
        __m128i _r1 = _mm_loadu_si128((const __m128i*)rows1p);
        __m128i _acc0 = _mm_add_epi16(_mm_mulhi_epi16(_r0, _b0), _mm_mulhi_epi16(_r1, _b1));
        __m128i _acc1 = _mm_add_epi16(_mm_mulhi_epi16(_r0, _b2), _mm_mulhi_epi16(_r1, _b3));
        _acc0 = _mm_srai_epi16(_mm_add_epi16(_acc0, _v2), 2);
        _acc1 = _mm_srai_epi16(_mm_add_epi16(_acc1, _v2), 2);
        __m128i _Dp0 = _mm_packus_epi16(_acc0, _acc0);
        __m128i _Dp1 = _mm_packus_epi16(_acc1, _acc1);
        _mm_storel_epi64((__m128i*)Dp0, _Dp0);
        _mm_storel_epi64((__m128i*)Dp1, _Dp1);
        Dp0 += 8;
        Dp1 += 8;
        rows0p += 8;
        rows1p += 8;
    }
#endif // __SSE2__
    for (; dx < wsize; dx++)
    {
        short s0 = *rows0p++;
        short s1 = *rows1p++;

        *Dp0++ = (unsigned char)(((short)((b0 * s0) >> 16) + (short)((b1 * s1) >> 16) + 2) >> 2);
        *Dp1++ = (unsigned char)(((short)((b2 * s0) >> 16) + (short)((b3 * s1) >> 16) + 2) >> 2);
    }
}